

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

void __thiscall
PythonModuleClient::PythonModuleClient(PythonModuleClient *this,string *id,string *addr,int port)

{
  string sStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)id);
  std::__cxx11::string::string((string *)&sStack_58,(string *)addr);
  AbstractModuleClient::AbstractModuleClient
            (&this->super_AbstractModuleClient,&local_38,&sStack_58,port);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_wrapper<AbstractModuleClient>).super_wrapper_base.m_self = (PyObject *)0x0;
  (this->super_AbstractModuleClient).super_MlmWrap._vptr_MlmWrap =
       (_func_int **)&PTR__PythonModuleClient_0043d1b0;
  return;
}

Assistant:

PythonModuleClient(std::string id, std::string addr, int port) : AbstractModuleClient(id, addr, port){
    }